

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

void __thiscall llvm::APInt::ashrInPlace(APInt *this,uint ShiftAmt)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  
  uVar1 = this->BitWidth;
  if (uVar1 < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x3ba,"void llvm::APInt::ashrInPlace(unsigned int)");
  }
  if (uVar1 < 0x41) {
    if (uVar1 != 0) {
      bVar2 = -(char)uVar1;
      uVar3 = 0x3f;
      if (uVar1 != ShiftAmt) {
        uVar3 = ShiftAmt;
      }
      (this->U).VAL =
           (ulong)((((long)((this->U).VAL << (bVar2 & 0x3f)) >> (bVar2 & 0x3f)) >>
                   ((byte)uVar3 & 0x3f)) << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
      return;
    }
    __assert_fail("B > 0 && \"Bit width can\'t be 0.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                  ,0x2f6,"int64_t llvm::SignExtend64(uint64_t, unsigned int)");
  }
  ashrSlowCase(this,ShiftAmt);
  return;
}

Assistant:

void ashrInPlace(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      int64_t SExtVAL = SignExtend64(U.VAL, BitWidth);
      if (ShiftAmt == BitWidth)
        U.VAL = SExtVAL >> (APINT_BITS_PER_WORD - 1); // Fill with sign bit.
      else
        U.VAL = SExtVAL >> ShiftAmt;
      clearUnusedBits();
      return;
    }
    ashrSlowCase(ShiftAmt);
  }